

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O1

CTcSymbol * CTcSymObjBase::read_from_sym_file(CVmFile *fp)

{
  uint uVar1;
  CTcPrsSymtab *this;
  undefined2 uVar2;
  char *pcVar3;
  size_t sVar4;
  CTcSymbol *pCVar5;
  CTcSymObjBase *this_00;
  char *buf_00;
  uint uVar6;
  ulong uVar7;
  char c;
  size_t sc_len;
  char buf [81];
  
  this_00 = (CTcSymObjBase *)0x0;
  pcVar3 = CTcParser::read_len_prefix_str(fp,buf,0x51,(size_t *)0x0,0x2db6);
  if (pcVar3 != (char *)0x0) {
    buf_00 = buf;
    CVmFile::read_bytes(fp,buf_00,2);
    uVar2 = buf._0_2_;
    uVar6 = (uint)(ushort)buf._0_2_;
    if ((ushort)buf._0_2_ - 1 < 2) {
      this = G_prs->global_symtab_;
      sVar4 = strlen(pcVar3);
      buf_00 = pcVar3;
      pCVar5 = CTcPrsSymtab::find(this,pcVar3,sVar4,(CTcPrsSymtab **)0x0);
      if (((pCVar5 != (CTcSymbol *)0x0) &&
          (*(int *)&(pCVar5->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24
           == 2)) &&
         ((uint)pCVar5[3].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.len_ == uVar6)
         ) {
        return pCVar5;
      }
    }
    this_00 = (CTcSymObjBase *)CTcSymbolBase::operator_new((CTcSymbolBase *)0xc0,(size_t)buf_00);
    sVar4 = strlen(pcVar3);
    uVar1 = G_cg->next_obj_;
    G_cg->next_obj_ = uVar1 + 1;
    CTcSymObjBase(this_00,pcVar3,sVar4,0,(ulong)uVar1,1,(uint)(ushort)uVar2,(CTcDictEntry *)0x0);
    (this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
    _vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_00320710;
    if (uVar6 == 0) {
      CVmFile::read_bytes(fp,&c,1);
      *(ushort *)&this_00->field_0xb8 =
           ((byte)c & 4) << 9 |
           (ushort)(((byte)c & 2) << 4) |
           (ushort)*(undefined4 *)&this_00->field_0xb8 & 0xfbdf | (ushort)(((byte)c & 1) << 10);
      CVmFile::read_bytes(fp,buf,2);
      uVar7 = (ulong)(ushort)buf._0_2_;
      if (uVar7 != 0) {
        do {
          pcVar3 = CTcParser::read_len_prefix_str(fp,buf,0x51,&sc_len,0x2db6);
          add_sc_name_entry(this_00,pcVar3,sc_len);
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
    }
  }
  return &this_00->super_CTcSymbol;
}

Assistant:

CTcSymbol *CTcSymObjBase::read_from_sym_file(CVmFile *fp)
{
    const char *txt;
    tc_metaclass_t meta;
    CTcSymObj *sym;
    char c;
    size_t cnt;
    size_t i;

    /* read the symbol name */
    if ((txt = base_read_from_sym_file(fp)) == 0)
        return 0;

    /* read the metaclass ID */
    meta = (tc_metaclass_t)fp->read_uint2();

    /* 
     *   If it's a dictionary object, check to see if it's already defined -
     *   a dictionary object can be exported from multiple modules without
     *   error, since dictionaries are shared across modules.
     *   
     *   The same applies to grammar productions, since a grammar production
     *   can be implicitly created in multiple files.  
     */
    if (meta == TC_META_DICT || meta == TC_META_GRAMPROD)
    {
        /* look for a previous instance of the symbol */
        CTcSymbol *old_sym =
            G_prs->get_global_symtab()->find(txt, strlen(txt));
        if (old_sym != 0
            && old_sym->get_type() == TC_SYM_OBJ
            && ((CTcSymObj *)old_sym)->get_metaclass() == meta)
        {
            /* 
             *   the dictionary is already in the symbol table - return the
             *   existing one, since there's no conflict with importing the
             *   dictionary from multiple places 
             */
            return old_sym;
        }
    }

    /* create the new symbol */
    sym = new CTcSymObj(txt, strlen(txt), FALSE, G_cg->new_obj_id(),
                        TRUE, meta, 0);

    /* if the metaclass is tads-object, read additional information */
    if (meta == TC_META_TADSOBJ)
    {
        /* read the root-object-superclass flag and the class-object flag */
        fp->read_bytes(&c, 1);
        sym->set_sc_is_root((c & 1) != 0);
        sym->set_is_class((c & 2) != 0);
        if ((c & 4) != 0)
            sym->set_transient();

        /* read the number of superclasses, and read the superclass names */
        cnt = fp->read_uint2();
        for (i = 0 ; i < cnt ; ++i)
        {
            char buf[TOK_SYM_MAX_LEN + 1];
            const char *sc_txt;
            size_t sc_len;

            /* read the symbol */
            sc_txt = CTcParser::read_len_prefix_str(
                fp, buf, sizeof(buf), &sc_len, TCERR_SYMEXP_SYM_TOO_LONG);

            /* add the superclass list entry to the symbol */
            sym->add_sc_name_entry(sc_txt, sc_len);
        }
    }

    /* return the symbol */
    return sym;
}